

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_value * mg_map_at(mg_map *map,char *key_str)

{
  uint32_t uVar1;
  size_t sVar2;
  
  sVar2 = strlen(key_str);
  if ((sVar2 < 0xffffffff) &&
     (uVar1 = mg_map_find_key(map,(uint32_t)sVar2,key_str), uVar1 != map->size)) {
    return map->values[uVar1];
  }
  return (mg_value *)0x0;
}

Assistant:

const mg_value *mg_map_at(const mg_map *map, const char *key_str) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return NULL;
  }
  return mg_map_at2(map, (uint32_t)key_size, key_str);
}